

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

void __thiscall dynamicgraph::Signal<double,_int>::trace(Signal<double,_int> *this,ostream *os)

{
  int iVar1;
  undefined4 extraout_var;
  ExceptionAbstract *err;
  ostream *os_local;
  Signal<double,_int> *this_local;
  
  iVar1 = (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1d])();
  signal_io_base<double>::trace((double *)CONCAT44(extraout_var,iVar1),os);
  return;
}

Assistant:

void Signal<T, Time>::trace(std::ostream &os) const {
  try {
    signal_io<T>::trace(this->accessCopy(), os);
  } catch DG_RETHROW catch (...) {
    DG_THROW ExceptionSignal(ExceptionSignal::SET_IMPOSSIBLE,
                             "TRACE operation not possible with this signal. ",
                             "(bad cast while getting value from %s).",
                             SignalBase<Time>::getName().c_str());
  }
}